

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_st(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int base,int offset)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 addr;
  TCGv_i64 t;
  TCGv_i32 pTVar1;
  TCGv_i32 helper_tmp_3;
  TCGv_i32 helper_tmp_2;
  TCGv_i32 helper_tmp_1;
  TCGv_i32 helper_tmp;
  int mem_idx;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int offset_local;
  int base_local;
  int rt_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx_00);
  t = tcg_temp_new_i64(tcg_ctx_00);
  helper_tmp._4_4_ = ctx->mem_idx;
  gen_base_offset_addr(ctx,addr,base,offset);
  gen_load_gpr(tcg_ctx_00,t,rt);
  if (opc == 0xa0000000) {
LAB_00d04087:
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx_00,t,addr,(long)helper_tmp._4_4_,MO_8);
    goto LAB_00d04134;
  }
  if (opc == 0xa4000000) {
LAB_00d0405a:
    tcg_gen_qemu_st_i64_mips64el
              (tcg_ctx_00,t,addr,(long)helper_tmp._4_4_,ctx->default_tcg_memop_mask | MO_16);
    goto LAB_00d04134;
  }
  if (opc == 0xa8000000) {
LAB_00d040ab:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,helper_tmp._4_4_);
    gen_helper_swl(tcg_ctx_00,tcg_ctx_00->cpu_env,t,addr,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    goto LAB_00d04134;
  }
  if (opc == 0xac000000) {
LAB_00d0402d:
    tcg_gen_qemu_st_i64_mips64el
              (tcg_ctx_00,t,addr,(long)helper_tmp._4_4_,ctx->default_tcg_memop_mask | MO_32);
  }
  else {
    if (opc == 0xb0000000) {
      pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,helper_tmp._4_4_);
      gen_helper_sdl(tcg_ctx_00,tcg_ctx_00->cpu_env,t,addr,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      goto LAB_00d04134;
    }
    if (opc == 0xb4000000) {
      pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,helper_tmp._4_4_);
      gen_helper_sdr(tcg_ctx_00,tcg_ctx_00->cpu_env,t,addr,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      goto LAB_00d04134;
    }
    if (opc != 0xb8000000) {
      if (opc == 0xfc000000) {
        tcg_gen_qemu_st_i64_mips64el
                  (tcg_ctx_00,t,addr,(long)helper_tmp._4_4_,ctx->default_tcg_memop_mask | MO_64);
        goto LAB_00d04134;
      }
      if (opc == 0x7c00001c) {
        helper_tmp._4_4_ = 2;
        goto LAB_00d04087;
      }
      if (opc == 0x7c00001d) {
        helper_tmp._4_4_ = 2;
        goto LAB_00d0405a;
      }
      if (opc == 0x7c00001f) {
        helper_tmp._4_4_ = 2;
        goto LAB_00d0402d;
      }
      if (opc == 0x7c000021) {
        helper_tmp._4_4_ = 2;
        goto LAB_00d040ab;
      }
      if (opc != 0x7c000022) goto LAB_00d04134;
      helper_tmp._4_4_ = 2;
    }
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,helper_tmp._4_4_);
    gen_helper_swr(tcg_ctx_00,tcg_ctx_00->cpu_env,t,addr,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
LAB_00d04134:
  tcg_temp_free_i64(tcg_ctx_00,addr);
  tcg_temp_free_i64(tcg_ctx_00,t);
  return;
}

Assistant:

static void gen_st(DisasContext *ctx, uint32_t opc, int rt,
                   int base, int offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int mem_idx = ctx->mem_idx;

    gen_base_offset_addr(ctx, t0, base, offset);
    gen_load_gpr(tcg_ctx, t1, rt);
    switch (opc) {
#if defined(TARGET_MIPS64)
    case OPC_SD:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEQ |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SDL:
        gen_helper_0e2i(sdl, t1, t0, mem_idx);
        break;
    case OPC_SDR:
        gen_helper_0e2i(sdr, t1, t0, mem_idx);
        break;
#endif
    case OPC_SWE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SW:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEUL |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SHE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SH:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEUW |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SBE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SB:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_8);
        break;
    case OPC_SWLE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SWL:
        gen_helper_0e2i(swl, t1, t0, mem_idx);
        break;
    case OPC_SWRE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SWR:
        gen_helper_0e2i(swr, t1, t0, mem_idx);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}